

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Iterator * leveldb::GetFileIterator(void *arg,ReadOptions *options,Slice *file_value)

{
  TableCache *this;
  Slice *options_00;
  size_t sVar1;
  char *pcVar2;
  uint64_t file_number;
  uint64_t file_size;
  Slice local_58;
  Slice local_48;
  Status local_38;
  TableCache *local_30;
  TableCache *cache;
  Slice *file_value_local;
  ReadOptions *options_local;
  void *arg_local;
  
  local_30 = (TableCache *)arg;
  cache = (TableCache *)file_value;
  file_value_local = (Slice *)options;
  options_local = (ReadOptions *)arg;
  sVar1 = Slice::size(file_value);
  options_00 = file_value_local;
  this = local_30;
  if (sVar1 == 0x10) {
    pcVar2 = Slice::data((Slice *)cache);
    file_number = DecodeFixed64(pcVar2);
    pcVar2 = Slice::data((Slice *)cache);
    file_size = DecodeFixed64(pcVar2 + 8);
    arg_local = TableCache::NewIterator
                          (this,(ReadOptions *)options_00,file_number,file_size,(Table **)0x0);
  }
  else {
    Slice::Slice(&local_48,"FileReader invoked with unexpected value");
    Slice::Slice(&local_58);
    Status::Corruption(&local_38,&local_48,&local_58);
    arg_local = NewErrorIterator(&local_38);
    Status::~Status(&local_38);
  }
  return (Iterator *)arg_local;
}

Assistant:

static Iterator* GetFileIterator(void* arg, const ReadOptions& options,
                                 const Slice& file_value) {
  TableCache* cache = reinterpret_cast<TableCache*>(arg);
  if (file_value.size() != 16) {
    return NewErrorIterator(
        Status::Corruption("FileReader invoked with unexpected value"));
  } else {
    return cache->NewIterator(options, DecodeFixed64(file_value.data()),
                              DecodeFixed64(file_value.data() + 8));
  }
}